

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O0

void Fxu_UpdateMatrixSingleClean(Fxu_Matrix *p,Fxu_Var *pVar1,Fxu_Var *pVar2,Fxu_Var *pVarNew)

{
  Fxu_Lit *local_98;
  Fxu_Lit *local_90;
  Fxu_Lit *local_88;
  Fxu_Lit *local_80;
  Fxu_Lit *local_78;
  Fxu_Lit *local_70;
  Fxu_Lit *local_68;
  Fxu_Lit *local_60;
  Fxu_Lit *local_58;
  Fxu_Lit *local_50;
  Fxu_Lit *local_48;
  Fxu_Lit *bLit2Next;
  Fxu_Lit *pLit2;
  Fxu_Lit *bLit1Next;
  Fxu_Lit *pLit1;
  Fxu_Var *pVarNew_local;
  Fxu_Var *pVar2_local;
  Fxu_Var *pVar1_local;
  Fxu_Matrix *p_local;
  
  bLit1Next = (pVar1->lLits).pHead;
  bLit2Next = (pVar2->lLits).pHead;
  if (bLit1Next == (Fxu_Lit *)0x0) {
    local_50 = (Fxu_Lit *)0x0;
  }
  else {
    local_50 = bLit1Next->pVNext;
  }
  pLit2 = local_50;
  if (bLit2Next == (Fxu_Lit *)0x0) {
    local_58 = (Fxu_Lit *)0x0;
  }
  else {
    local_58 = bLit2Next->pVNext;
  }
  local_48 = local_58;
  while( true ) {
    while( true ) {
      while ((bLit1Next != (Fxu_Lit *)0x0 && (bLit2Next != (Fxu_Lit *)0x0))) {
        if (bLit1Next->pCube->pVar->iVar == bLit2Next->pCube->pVar->iVar) {
          if (bLit1Next->iCube == bLit2Next->iCube) {
            if (bLit1Next->pCube->pOrder != (Fxu_Cube *)0x0) {
              __assert_fail("pLit1->pCube->pOrder == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxu/fxuUpdate.c"
                            ,0x202,
                            "void Fxu_UpdateMatrixSingleClean(Fxu_Matrix *, Fxu_Var *, Fxu_Var *, Fxu_Var *)"
                           );
            }
            *p->ppTailCubes = bLit1Next->pCube;
            p->ppTailCubes = &bLit1Next->pCube->pOrder;
            bLit1Next->pCube->pOrder = (Fxu_Cube *)0x1;
            Fxu_MatrixAddLiteral(p,bLit1Next->pCube,pVarNew);
            Fxu_UpdateCleanOldDoubles(p,(Fxu_Double *)0x0,bLit1Next->pCube);
            Fxu_MatrixDelLiteral(p,bLit1Next);
            Fxu_MatrixDelLiteral(p,bLit2Next);
            bLit1Next = pLit2;
            bLit2Next = local_48;
            if (pLit2 == (Fxu_Lit *)0x0) {
              local_60 = (Fxu_Lit *)0x0;
            }
            else {
              local_60 = pLit2->pVNext;
            }
            pLit2 = local_60;
            if (local_48 == (Fxu_Lit *)0x0) {
              local_68 = (Fxu_Lit *)0x0;
            }
            else {
              local_68 = local_48->pVNext;
            }
            local_48 = local_68;
          }
          else if (bLit1Next->iCube < bLit2Next->iCube) {
            bLit1Next = pLit2;
            if (pLit2 == (Fxu_Lit *)0x0) {
              local_70 = (Fxu_Lit *)0x0;
            }
            else {
              local_70 = pLit2->pVNext;
            }
            pLit2 = local_70;
          }
          else {
            bLit2Next = local_48;
            if (local_48 == (Fxu_Lit *)0x0) {
              local_78 = (Fxu_Lit *)0x0;
            }
            else {
              local_78 = local_48->pVNext;
            }
            local_48 = local_78;
          }
        }
        else if (bLit1Next->pCube->pVar->iVar < bLit2Next->pCube->pVar->iVar) {
          bLit1Next = pLit2;
          if (pLit2 == (Fxu_Lit *)0x0) {
            local_80 = (Fxu_Lit *)0x0;
          }
          else {
            local_80 = pLit2->pVNext;
          }
          pLit2 = local_80;
        }
        else {
          bLit2Next = local_48;
          if (local_48 == (Fxu_Lit *)0x0) {
            local_88 = (Fxu_Lit *)0x0;
          }
          else {
            local_88 = local_48->pVNext;
          }
          local_48 = local_88;
        }
      }
      if ((bLit1Next == (Fxu_Lit *)0x0) || (bLit2Next != (Fxu_Lit *)0x0)) break;
      bLit1Next = pLit2;
      if (pLit2 == (Fxu_Lit *)0x0) {
        local_90 = (Fxu_Lit *)0x0;
      }
      else {
        local_90 = pLit2->pVNext;
      }
      pLit2 = local_90;
    }
    if ((bLit1Next != (Fxu_Lit *)0x0) || (bLit2Next == (Fxu_Lit *)0x0)) break;
    bLit2Next = local_48;
    if (local_48 == (Fxu_Lit *)0x0) {
      local_98 = (Fxu_Lit *)0x0;
    }
    else {
      local_98 = local_48->pVNext;
    }
    local_48 = local_98;
  }
  return;
}

Assistant:

void Fxu_UpdateMatrixSingleClean( Fxu_Matrix * p, Fxu_Var * pVar1, Fxu_Var * pVar2, Fxu_Var * pVarNew )
{
    Fxu_Lit * pLit1, * bLit1Next;
    Fxu_Lit * pLit2, * bLit2Next;

    // initialize the starting literals
    pLit1     = pVar1->lLits.pHead;
    pLit2     = pVar2->lLits.pHead;
    bLit1Next = pLit1? pLit1->pVNext: NULL;
    bLit2Next = pLit2? pLit2->pVNext: NULL;
    while ( 1 )
    {
        if ( pLit1 && pLit2 )
        {
            if ( pLit1->pCube->pVar->iVar == pLit2->pCube->pVar->iVar )
            { // these literals coincide 
                if ( pLit1->iCube == pLit2->iCube )
                { // these literals coincide 
                
                    // collect the affected cube
                    assert( pLit1->pCube->pOrder == NULL );
                    Fxu_MatrixRingCubesAdd( p, pLit1->pCube );

                    // add the literal to this cube corresponding to the new column
                    Fxu_MatrixAddLiteral( p, pLit1->pCube, pVarNew );
                    // clean the old cubes
                    Fxu_UpdateCleanOldDoubles( p, NULL, pLit1->pCube );

                    // remove the literals 
                    Fxu_MatrixDelLiteral( p, pLit1 );
                    Fxu_MatrixDelLiteral( p, pLit2 );

                    // go to the next literals
                    pLit1     = bLit1Next;
                    pLit2     = bLit2Next;
                    bLit1Next = pLit1? pLit1->pVNext: NULL;
                    bLit2Next = pLit2? pLit2->pVNext: NULL;
                }
                else if ( pLit1->iCube < pLit2->iCube )
                {
                    pLit1     = bLit1Next;
                    bLit1Next = pLit1? pLit1->pVNext: NULL;
                }
                else
                {
                    pLit2     = bLit2Next;
                    bLit2Next = pLit2? pLit2->pVNext: NULL;
                }
            }
            else if ( pLit1->pCube->pVar->iVar < pLit2->pCube->pVar->iVar )
            {
                pLit1     = bLit1Next;
                bLit1Next = pLit1? pLit1->pVNext: NULL;
            }
            else
            {
                pLit2     = bLit2Next;
                bLit2Next = pLit2? pLit2->pVNext: NULL;
            }
        }
        else if ( pLit1 && !pLit2 )
        {
            pLit1     = bLit1Next;
            bLit1Next = pLit1? pLit1->pVNext: NULL;
        }
        else if ( !pLit1 && pLit2 )
        {
            pLit2     = bLit2Next;
            bLit2Next = pLit2? pLit2->pVNext: NULL;
        }
        else
            break;
    }
}